

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void av1_read_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r,int x_mis,int y_mis)

{
  MB_MODE_INFO *mi_00;
  int iVar1;
  AV1_COMMON *cm_00;
  int in_ECX;
  DecoderCodingBlock *in_RDX;
  AV1Decoder *in_RSI;
  long in_RDI;
  int in_R8D;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  DecoderCodingBlock *in_stack_00000038;
  AV1_COMMON *in_stack_00000040;
  AV1Decoder *pbi_00;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3b60);
  mi_00 = *(in_RSI->dcb).xd.mi;
  *(ushort *)&mi_00->field_0xa7 = *(ushort *)&mi_00->field_0xa7 & 0xff7f;
  pbi_00 = in_RSI;
  iVar1 = frame_is_intra_only(cm_00);
  if (iVar1 == 0) {
    read_inter_frame_mode_info(pbi_00,in_RDX,(aom_reader *)CONCAT44(in_ECX,in_R8D));
    if (*(int *)(*(long *)(in_RDI + 0x9be8) + 0x34) != 0) {
      av1_copy_frame_mvs(cm_00,mi_00,(in_RSI->dcb).xd.mi_row,(in_RSI->dcb).xd.mi_col,in_ECX,in_R8D);
    }
  }
  else {
    read_intra_frame_mode_info(in_stack_00000040,in_stack_00000038,(aom_reader *)pbi);
    if (*(int *)(*(long *)(in_RDI + 0x9be8) + 0x34) != 0) {
      intra_copy_frame_mvs(cm_00,(in_RSI->dcb).xd.mi_row,(in_RSI->dcb).xd.mi_col,in_ECX,in_R8D);
    }
  }
  return;
}

Assistant:

void av1_read_mode_info(AV1Decoder *const pbi, DecoderCodingBlock *dcb,
                        aom_reader *r, int x_mis, int y_mis) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mi = xd->mi[0];
  mi->use_intrabc = 0;

  if (frame_is_intra_only(cm)) {
    read_intra_frame_mode_info(cm, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      intra_copy_frame_mvs(cm, xd->mi_row, xd->mi_col, x_mis, y_mis);
  } else {
    read_inter_frame_mode_info(pbi, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      av1_copy_frame_mvs(cm, mi, xd->mi_row, xd->mi_col, x_mis, y_mis);
  }
}